

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin.c
# Opt level: O1

_Bool bin_update_shard_size(uint *bin_shard_sizes,size_t start_size,size_t end_size,size_t nshards)

{
  long lVar1;
  uint uVar2;
  undefined8 in_RAX;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  uint uVar7;
  uint local_34;
  
  if (start_size < 0x3801 && 0xffffffffffffffbf < nshards - 0x41) {
    sVar6 = 0x3800;
    if (end_size < 0x3800) {
      sVar6 = end_size;
    }
    uVar7 = 0;
    local_34 = 0;
    if (start_size != 0) {
      if (start_size < 9) {
        bin_update_shard_size_cold_1();
        local_34 = (uint)((ulong)in_RAX >> 0x20);
      }
      else {
        uVar5 = start_size * 2 - 1;
        lVar1 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar2 = (uint)lVar1;
        iVar4 = uVar2 - 6;
        if (uVar2 < 6) {
          iVar4 = 0;
        }
        bVar3 = 4;
        if (6 < uVar2) {
          bVar3 = (char)lVar1 - 3;
        }
        local_34 = ((uint)(((start_size - 1 >> (bVar3 & 0x3f)) << (bVar3 & 0x3f)) >> (bVar3 & 0x3f))
                   & 3) + iVar4 * 4 + 1;
      }
    }
    if (end_size != 0) {
      if (end_size < 9) {
        if (end_size == 1) {
          uVar5 = 1;
        }
        else {
          lVar1 = 0x3f;
          if (sVar6 - 1 != 0) {
            for (; sVar6 - 1 >> lVar1 == 0; lVar1 = lVar1 + -1) {
            }
          }
          uVar5 = 1L << ((char)lVar1 + 1U & 0x3f);
        }
        lVar1 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar7 = (uint)lVar1 - 3;
        if ((uint)lVar1 < 3) {
          uVar7 = 0;
        }
      }
      else {
        uVar5 = sVar6 * 2 - 1;
        lVar1 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar7 = (uint)lVar1;
        iVar4 = uVar7 - 6;
        if (uVar7 < 6) {
          iVar4 = 0;
        }
        bVar3 = 4;
        if (6 < uVar7) {
          bVar3 = (char)lVar1 - 3;
        }
        uVar7 = ((uint)(((sVar6 - 1 >> (bVar3 & 0x3f)) << (bVar3 & 0x3f)) >> (bVar3 & 0x3f)) & 3) +
                1 + iVar4 * 4;
      }
    }
    for (; local_34 <= uVar7; local_34 = local_34 + 1) {
      bin_shard_sizes[local_34] = (uint)nshards;
    }
  }
  return nshards - 0x41 < 0xffffffffffffffc0;
}

Assistant:

bool
bin_update_shard_size(unsigned bin_shard_sizes[SC_NBINS], size_t start_size,
    size_t end_size, size_t nshards) {
	if (nshards > BIN_SHARDS_MAX || nshards == 0) {
		return true;
	}

	if (start_size > SC_SMALL_MAXCLASS) {
		return false;
	}
	if (end_size > SC_SMALL_MAXCLASS) {
		end_size = SC_SMALL_MAXCLASS;
	}

	/* Compute the index since this may happen before sz init. */
	szind_t ind1 = sz_size2index_compute(start_size);
	szind_t ind2 = sz_size2index_compute(end_size);
	for (unsigned i = ind1; i <= ind2; i++) {
		bin_shard_sizes[i] = (unsigned)nshards;
	}

	return false;
}